

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CI_String.hpp
# Opt level: O2

int OpenMD::Utils::ci_char_traits::compare(char *s1_,char *s2_,size_t count_)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  sVar3 = 0;
  while( true ) {
    if (count_ == sVar3) {
      return 0;
    }
    iVar1 = toupper((int)s1_[sVar3]);
    iVar2 = toupper((int)s2_[sVar3]);
    if (iVar1 < iVar2) break;
    if (iVar2 < iVar1) {
      return 1;
    }
    sVar3 = sVar3 + 1;
  }
  return -1;
}

Assistant:

static int compare(const char* s1_, const char* s2_,
                       std::size_t count_) noexcept {
      while (count_-- != 0) {
        if (std::toupper(*s1_) < std::toupper(*s2_)) return -1;
        if (std::toupper(*s1_) > std::toupper(*s2_)) return 1;

        ++s1_;
        ++s2_;
      }

      return 0;
    }